

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall backend::codegen::Codegen::translate_branch(Codegen *this,JumpInstruction *j)

{
  _Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_> _Var1;
  _Head_base<0UL,_arm::Inst_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  pointer puVar7;
  LabelId LVar8;
  LabelId LVar9;
  undefined1 *puVar10;
  undefined3 uVar11;
  undefined8 uVar12;
  ConditionCode CVar13;
  Reg RVar14;
  OpCode OVar15;
  Inst *pIVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  uint *puVar19;
  undefined **ppuVar20;
  Inst *pIVar21;
  ConditionCode unaff_BPL;
  uint32_t in_R8D;
  pointer *__ptr;
  bool bVar22;
  string_view function_name;
  string_view function_name_00;
  string_view function_name_01;
  string_view function_name_02;
  string_view function_name_03;
  string_view function_name_04;
  _Head_base<0UL,_arm::Inst_*,_false> local_90;
  _Head_base<0UL,_arm::Inst_*,_false> local_88;
  undefined1 local_80 [8];
  _Move_ctor_base<false,_arm::RegisterOperand,_int> local_78;
  undefined1 local_60 [8];
  _Move_ctor_base<false,_arm::RegisterOperand,_int> local_58;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_40;
  Reg local_34;
  
  LVar8 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true;
  LVar9 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
          super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false;
  bVar22 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload
           .super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
  uVar11 = *(undefined3 *)
            &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
             _M_payload.super__Optional_payload_base<backend::codegen::LastJump>.field_0xd;
  *(undefined4 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_payload =
       *(undefined4 *)
        &(this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
         super__Optional_payload_base<backend::codegen::LastJump>._M_payload;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true = LVar8;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false = LVar9;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = bVar22;
  *(undefined3 *)
   &(this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>.field_0xd = uVar11;
  if ((this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_engaged == true) {
    (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
  }
  puVar19 = &switchD_001685e8::switchdataD_001bb35c;
  switch(j->kind) {
  case Undefined:
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    puVar18 = (undefined8 *)operator_new(8);
    *puVar18 = std::__cxx11::string::operator=;
    *puVar17 = puVar18;
    __cxa_throw(puVar17,&std::exception*::typeinfo,0);
  case Return:
    if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
      RVar14 = arm::make_register(GeneralPurpose,0);
      if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) goto LAB_00168fb9;
      local_60 = (undefined1  [8])&PTR_display_001ee058;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
           (_Variadic_union<int>)
           (j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
           super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
      OVar15 = get_or_alloc_vgp(this,(VarId *)local_60);
      local_80 = (undefined1  [8])operator_new(0x38);
      ((Inst *)((long)local_80 + 0x20))->op = OVar15;
      *(undefined2 *)&((Inst *)((long)local_80 + 0x20))->cond = 1;
      ((Inst *)local_80)->op = Mov;
      ((Inst *)local_80)->cond = Always;
      (((Inst *)local_80)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001f0948;
      *(Reg *)&(((Inst *)((long)local_80 + 0x10))->super_Displayable)._vptr_Displayable = RVar14;
      *(undefined1 *)&(((Inst *)((long)local_80 + 0x30))->super_Displayable)._vptr_Displayable = 0;
      (((Inst *)((long)local_80 + 0x20))->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001f07d8;
      ppuVar20 = &PTR_display_001f0838;
      *(undefined ***)&((Inst *)((long)local_80 + 0x10))->op = &PTR_display_001f0838;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)local_80);
      puVar19 = (uint *)ppuVar20;
      if (local_80 != (undefined1  [8])0x0) {
        (*((Displayable *)local_80)->_vptr_Displayable[2])();
        puVar19 = (uint *)ppuVar20;
      }
    }
    function_name._M_str = (char *)puVar19;
    function_name._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    format_fn_end_label_abi_cxx11_
              ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name);
    local_90._M_head_impl = (Inst *)operator_new(0x38);
    uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
             super_Displayable._vptr_Displayable;
    puVar10 = (undefined1 *)
              ((long)&local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
    _Var1.super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Head_base<0UL,_arm::Inst_*,_false>)
         ((long)&local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
    if ((_Head_base<0UL,_arm::Inst_*,_false>)local_80 ==
        _Var1.super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl) {
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
      local_60 = (undefined1  [8])puVar10;
    }
    else {
      local_60 = local_80;
    }
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
         super_Displayable._vptr_Displayable;
    local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
    local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
    (local_90._M_head_impl)->op = B;
    (local_90._M_head_impl)->cond = Always;
    ((local_90._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0988;
    local_90._M_head_impl[1].super_Displayable._vptr_Displayable =
         (_func_int **)(local_90._M_head_impl + 2);
    local_80 = (undefined1  [8])_Var1.super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_90._M_head_impl + 1),local_60,
               (undefined1 *)(uVar12 + (long)local_60));
    *(undefined4 *)&local_90._M_head_impl[3].super_Displayable._vptr_Displayable = 0;
    if (local_60 != (undefined1  [8])puVar10) {
      operator_delete((void *)local_60,
                      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
    }
    local_88._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    break;
  case BrCond:
    puVar6 = (this->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((((ulong)((long)puVar6 -
                 (long)(this->inst).
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) ||
        (pIVar16 = puVar6[-2]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                   ._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar16->op != Mov)) ||
       (pIVar21 = puVar6[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                  _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl, pIVar21->op != Mov)) {
LAB_001687e4:
      bVar22 = false;
    }
    else {
      if ((pIVar16 == (Inst *)0x0) ||
         ((pIVar16->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001f0948)) {
        pIVar16 = (Inst *)0x0;
      }
      if ((pIVar21 == (Inst *)0x0) ||
         ((pIVar21->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001f0948)) {
        pIVar21 = (Inst *)0x0;
      }
      if (*(int *)&pIVar16[1].super_Displayable._vptr_Displayable !=
          *(int *)&pIVar21[1].super_Displayable._vptr_Displayable) goto LAB_001687e4;
      bVar22 = false;
      if ((*(char *)&pIVar16[3].super_Displayable._vptr_Displayable == '\x01') &&
         (*(int *)&pIVar16[2].super_Displayable._vptr_Displayable == 0)) {
        bVar22 = false;
        if ((*(char *)&pIVar21[3].super_Displayable._vptr_Displayable == '\x01') &&
           (bVar22 = false, *(int *)&pIVar21[2].super_Displayable._vptr_Displayable == 1)) {
          if (pIVar16->cond != Always) goto LAB_001687e4;
          unaff_BPL = pIVar21->cond;
          bVar22 = unaff_BPL != Always;
        }
      }
    }
    local_40 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    iVar4 = j->bb_true;
    iVar5 = j->bb_false;
    bVar3 = (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>.
            _M_payload.super__Optional_payload_base<backend::codegen::LastJump>._M_engaged;
    if (bVar22) {
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = unaff_BPL;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true = iVar4;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false = iVar5;
      if (bVar3 == false) {
        (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
        super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
      }
      puVar7 = (this->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar6 = puVar7 + -1;
      (this->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
      pIVar16 = puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if (pIVar16 != (Inst *)0x0) {
        (*(pIVar16->super_Displayable)._vptr_Displayable[2])();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar7 = (this->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar6 = puVar7 + -1;
      (this->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
      pIVar16 = puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      if (pIVar16 != (Inst *)0x0) {
        (*(pIVar16->super_Displayable)._vptr_Displayable[2])();
      }
      (puVar6->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      function_name_01._M_str._0_4_ = j->bb_false;
      function_name_01._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_01._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name_01,
                 in_R8D);
      CVar13 = arm::invert_cond(unaff_BPL);
      local_90._M_head_impl = (Inst *)operator_new(0x38);
      uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
               super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
               super_Displayable._vptr_Displayable;
      puVar10 = (undefined1 *)
                ((long)&local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
      _Var2._M_head_impl =
           (Inst *)((long)&local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
      if (local_80 == (undefined1  [8])_Var2._M_head_impl) {
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
        local_60 = (undefined1  [8])puVar10;
      }
      else {
        local_60 = local_80;
      }
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
           super_Displayable._vptr_Displayable;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
      (local_90._M_head_impl)->op = B;
      (local_90._M_head_impl)->cond = CVar13;
      ((local_90._M_head_impl)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001f0988;
      local_90._M_head_impl[1].super_Displayable._vptr_Displayable =
           (_func_int **)(local_90._M_head_impl + 2);
      local_80 = (undefined1  [8])_Var2._M_head_impl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_90._M_head_impl + 1),local_60,
                 (undefined1 *)(uVar12 + (long)local_60));
      *(undefined4 *)&local_90._M_head_impl[3].super_Displayable._vptr_Displayable = 0;
      if (local_60 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_60,
                        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
      }
      local_88._M_head_impl = local_90._M_head_impl;
      local_90._M_head_impl = (Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_40,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
      if (local_88._M_head_impl != (Inst *)0x0) {
        (*((local_88._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      local_88._M_head_impl = (Inst *)0x0;
      if ((BrInst *)local_90._M_head_impl != (BrInst *)0x0) {
        std::default_delete<arm::BrInst>::operator()
                  ((default_delete<arm::BrInst> *)&local_90,(BrInst *)local_90._M_head_impl);
      }
      local_90._M_head_impl = (Inst *)0x0;
      if (local_80 != (undefined1  [8])_Var2._M_head_impl) {
        operator_delete((void *)local_80,
                        CONCAT44(local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_
                                 ,local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                                  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_
                                ) + 1);
      }
      function_name_03._M_str._0_4_ = j->bb_true;
      function_name_03._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_03._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name_03,
                 in_R8D);
      pIVar16 = (Inst *)operator_new(0x38);
      uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
               super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
               super_Displayable._vptr_Displayable;
      if (local_80 == (undefined1  [8])_Var2._M_head_impl) {
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
        local_60 = (undefined1  [8])puVar10;
      }
      else {
        local_60 = local_80;
      }
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
           super_Displayable._vptr_Displayable;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
      pIVar16->op = B;
      pIVar16->cond = Always;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0988;
      pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
      local_80 = (undefined1  [8])_Var2._M_head_impl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar16 + 1),local_60,(undefined1 *)(uVar12 + (long)local_60));
      *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
      local_90._M_head_impl = pIVar16;
      if (local_60 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_60,
                        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
      }
      local_88._M_head_impl = local_90._M_head_impl;
      local_90._M_head_impl = (Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_40,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    }
    else {
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.cond = NotEqual;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_true = iVar4;
      (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
      super__Optional_payload_base<backend::codegen::LastJump>._M_payload._M_value.bb_false = iVar5;
      if (bVar3 == false) {
        (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
        super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = true;
      }
      if ((j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
LAB_00168fb9:
        std::__throw_bad_optional_access();
      }
      local_60 = (undefined1  [8])&PTR_display_001ee058;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
           (_Variadic_union<int>)
           (j->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
           super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
      local_34 = get_or_alloc_vgp(this,(VarId *)local_60);
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable =
           (Displayable)
           ((ulong)local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
                   super_Displayable._vptr_Displayable & 0xffffffff00000000);
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index = 1;
      local_80 = (undefined1  [8])&PTR_display_001f0838;
      pIVar16 = (Inst *)operator_new(0x38);
      std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
                (&local_58,&local_78);
      local_60 = (undefined1  [8])&PTR_display_001f0838;
      pIVar16->op = Cmp;
      pIVar16->cond = Always;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0948;
      *(Reg *)&pIVar16[1].super_Displayable._vptr_Displayable = local_34;
      local_88._M_head_impl = pIVar16 + 2;
      *(undefined1 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0xff;
      *(__index_type *)&pIVar16[3].super_Displayable._vptr_Displayable =
           local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr
        [(long)(char)local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                     super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict8 *)&local_88,
                 (variant<arm::RegisterOperand,_int> *)&local_58);
      *(undefined ***)&pIVar16[1].op = &PTR_display_001f0838;
      local_90._M_head_impl = pIVar16;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_40,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_90);
      if (local_90._M_head_impl != (Inst *)0x0) {
        (*((local_90._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      function_name_02._M_str._0_4_ = j->bb_false;
      function_name_02._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_02._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name_02,
                 in_R8D);
      pIVar16 = (Inst *)operator_new(0x38);
      uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
               super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
               super_Displayable._vptr_Displayable;
      puVar10 = (undefined1 *)
                ((long)&local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
      _Var2._M_head_impl =
           (Inst *)((long)&local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
      if (local_80 == (undefined1  [8])_Var2._M_head_impl) {
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
        local_60 = (undefined1  [8])puVar10;
      }
      else {
        local_60 = local_80;
      }
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
           super_Displayable._vptr_Displayable;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
      pIVar16->op = B;
      pIVar16->cond = Equal;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0988;
      pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
      local_80 = (undefined1  [8])_Var2._M_head_impl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar16 + 1),local_60,(undefined1 *)(uVar12 + (long)local_60));
      *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
      local_90._M_head_impl = pIVar16;
      if (local_60 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_60,
                        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
      }
      local_88._M_head_impl = local_90._M_head_impl;
      local_90._M_head_impl = (Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_40,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
      if (local_88._M_head_impl != (Inst *)0x0) {
        (*((local_88._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
      }
      local_88._M_head_impl = (Inst *)0x0;
      if ((BrInst *)local_90._M_head_impl != (BrInst *)0x0) {
        std::default_delete<arm::BrInst>::operator()
                  ((default_delete<arm::BrInst> *)&local_90,(BrInst *)local_90._M_head_impl);
      }
      local_90._M_head_impl = (Inst *)0x0;
      if (local_80 != (undefined1  [8])_Var2._M_head_impl) {
        operator_delete((void *)local_80,
                        CONCAT44(local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_
                                 ,local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                                  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_
                                ) + 1);
      }
      function_name_04._M_str._0_4_ = j->bb_true;
      function_name_04._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
      function_name_04._M_str._4_4_ = 0;
      format_bb_label_abi_cxx11_
                ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name_04,
                 in_R8D);
      pIVar16 = (Inst *)operator_new(0x38);
      uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
               super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
               super_Displayable._vptr_Displayable;
      if (local_80 == (undefined1  [8])_Var2._M_head_impl) {
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
        super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
        local_60 = (undefined1  [8])puVar10;
      }
      else {
        local_60 = local_80;
      }
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
           super_Displayable._vptr_Displayable;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
      super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
      local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
      pIVar16->op = B;
      pIVar16->cond = Always;
      (pIVar16->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f0988;
      pIVar16[1].super_Displayable._vptr_Displayable = (_func_int **)(pIVar16 + 2);
      local_80 = (undefined1  [8])_Var2._M_head_impl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pIVar16 + 1),local_60,(undefined1 *)(uVar12 + (long)local_60));
      *(undefined4 *)&pIVar16[3].super_Displayable._vptr_Displayable = 0;
      local_90._M_head_impl = pIVar16;
      if (local_60 != (undefined1  [8])puVar10) {
        operator_delete((void *)local_60,
                        local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                        super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
      }
      local_88._M_head_impl = local_90._M_head_impl;
      local_90._M_head_impl = (Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                (local_40,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    }
    break;
  case Br:
    function_name_00._M_str._0_4_ = j->bb_true;
    function_name_00._M_len = (size_t)(this->func->name)._M_dataplus._M_p;
    function_name_00._M_str._4_4_ = 0;
    format_bb_label_abi_cxx11_
              ((string *)local_80,(codegen *)(this->func->name)._M_string_length,function_name_00,
               in_R8D);
    local_90._M_head_impl = (Inst *)operator_new(0x38);
    uVar12 = local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
             super_Displayable._vptr_Displayable;
    puVar10 = (undefined1 *)
              ((long)&local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
    _Var2._M_head_impl =
         (Inst *)((long)&local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8);
    if (local_80 == (undefined1  [8])_Var2._M_head_impl) {
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._17_3_;
      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
      super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_ =
           local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._20_4_;
      local_60 = (undefined1  [8])puVar10;
    }
    else {
      local_60 = local_80;
    }
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_ =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_;
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.reg =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_;
    local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
         super_Displayable._vptr_Displayable;
    local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x0;
    local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ =
         local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_ & 0xffffff00;
    (local_90._M_head_impl)->op = B;
    (local_90._M_head_impl)->cond = Always;
    ((local_90._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0988;
    local_90._M_head_impl[1].super_Displayable._vptr_Displayable =
         (_func_int **)(local_90._M_head_impl + 2);
    local_80 = (undefined1  [8])_Var2._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_90._M_head_impl + 1),local_60,
               (undefined1 *)(uVar12 + (long)local_60));
    *(undefined4 *)&local_90._M_head_impl[3].super_Displayable._vptr_Displayable = 0;
    if (local_60 != (undefined1  [8])puVar10) {
      operator_delete((void *)local_60,
                      local_58.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                      super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ + 1);
    }
    local_88._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    break;
  default:
    goto switchD_001685e8_default;
  }
  if (local_88._M_head_impl != (Inst *)0x0) {
    (*((local_88._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  local_88._M_head_impl = (Inst *)0x0;
  if ((BrInst *)local_90._M_head_impl != (BrInst *)0x0) {
    std::default_delete<arm::BrInst>::operator()
              ((default_delete<arm::BrInst> *)&local_90,(BrInst *)local_90._M_head_impl);
  }
  local_90._M_head_impl = (Inst *)0x0;
  if (local_80 !=
      (undefined1  [8])
      ((long)&local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
              super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u + 8)) {
    operator_delete((void *)local_80,
                    CONCAT44(local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._12_4_,
                             local_78.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                             super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_4_) + 1
                   );
  }
switchD_001685e8_default:
  return;
}

Assistant:

void Codegen::translate_branch(mir::inst::JumpInstruction& j) {
  last_jump = std::move(this_jump);
  this_jump = std::nullopt;
  switch (j.kind) {
    case mir::inst::JumpInstructionKind::Br:
      inst.push_back(std::make_unique<BrInst>(
          OpCode::B, format_bb_label(func.name, j.bb_true)));
      break;
    case mir::inst::JumpInstructionKind::BrCond: {
      auto back = inst.end() - 2;

      // Find if a comparison exists
      std::optional<ConditionCode> cond = std::nullopt;
      if (inst.size() >= 2) {
        auto b1 = back->get();
        auto b2 = (back + 1)->get();
        if (b1->op == arm::OpCode::Mov && b2->op == arm::OpCode::Mov) {
          auto b1m = dynamic_cast<Arith2Inst*>(b1);
          auto b2m = dynamic_cast<Arith2Inst*>(b2);
          if (b1m->r1 == b2m->r1 && b1m->r2 == 0 && b2m->r2 == 1 &&
              b1m->cond == arm::ConditionCode::Always &&
              b2m->cond != arm::ConditionCode::Always) {
            cond = {b2m->cond};
          }
        }
      }
      if (cond) {
        this_jump = LastJump{cond.value(), j.bb_true, j.bb_false};
        inst.pop_back();
        inst.pop_back();
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            invert_cond(cond.value())));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      } else {
        this_jump = LastJump{ConditionCode::NotEqual, j.bb_true, j.bb_false};
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Cmp, translate_var_reg(j.cond_or_ret.value()),
            Operand2(0)));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            ConditionCode::Equal));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      }
    } break;
    case mir::inst::JumpInstructionKind::Return:
      if (j.cond_or_ret.has_value()) {
        // Move return value to its register
        // if (j.cond_or_ret.value().id != 0) {
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Mov, make_register(arm::RegisterKind::GeneralPurpose, 0),
            RegisterOperand(translate_var_reg(j.cond_or_ret.value()))));
        // }
      }
      inst.push_back(
          std::make_unique<BrInst>(OpCode::B, format_fn_end_label(func.name)));
      // Jumps to function end, the rest is cleanup generation in function
      // `generate_return_and_cleanup`
      break;
    case mir::inst::JumpInstructionKind::Undefined:
      // WARN: Error about undefined blocks
      throw new std::exception();
      break;
    case mir::inst::JumpInstructionKind::Unreachable:
      // TODO: Discard unreachable blocks beforhand
      break;
  }
}